

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O1

string * __thiscall Interval::dump_abi_cxx11_(string *__return_storage_ptr__,Interval *this)

{
  Datetime *pDVar1;
  _Rb_tree_header *p_Var2;
  time_t tVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  stringstream out;
  string local_1e8;
  Interval *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"interval",8);
  if (this->id != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," @",2);
    std::ostream::operator<<(local_1a8,this->id);
  }
  pDVar1 = &(this->super_Range).start;
  tVar3 = Datetime::toEpoch(pDVar1);
  if (tVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
    Datetime::toISOLocalExtended_abi_cxx11_(&local_1e8,pDVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               (char *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_),
               local_1e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_) !=
        &local_1e8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_),
                      local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  pDVar1 = &(this->super_Range).end;
  tVar3 = Datetime::toEpoch(pDVar1);
  if (tVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," - ",3);
    Datetime::toISOLocalExtended_abi_cxx11_(&local_1e8,pDVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               (char *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_),
               local_1e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_) !=
        &local_1e8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_),
                      local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  local_1c8 = this;
  if ((this->_tags)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," #",2);
    p_Var5 = (local_1c8->_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(local_1c8->_tags)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var2) {
      do {
        local_1e8._M_dataplus._M_p._0_1_ = 0x20;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1e8,1);
        quoteIfNeeded(&local_1e8,(string *)(p_Var5 + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,
                                           local_1e8._M_dataplus._M_p._0_1_),
                   local_1e8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_) !=
            &local_1e8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_
                                  ),local_1e8.field_2._M_allocated_capacity + 1);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var2);
    }
  }
  if (local_1c8->synthetic == true) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," synthetic",10);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_1c0;
}

Assistant:

std::string Interval::dump () const
{
  std::stringstream out;

  out << "interval";

  if (id)
    out << " @" << id;

  if (start.toEpoch ())
    out << " " << start.toISOLocalExtended ();

  if (end.toEpoch ())
    out << " - " << end.toISOLocalExtended ();

  if (! _tags.empty ())
  {
    out << " #";
    for (auto& tag : _tags)
      out << ' ' << quoteIfNeeded (tag);
  }

  if (synthetic)
    out << " synthetic";

  return out.str ();
}